

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score_function.h
# Opt level: O0

void __thiscall xLearn::Score::~Score(Score *this)

{
  code *pcVar1;
  Score *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Score() { }